

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskBaseCase::preDraw(SampleMaskBaseCase *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder local_190;
  long lVar2;
  
  iVar1 = (*((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_runMode == RUN_PER_TWO_SAMPLES) {
    (**(code **)(lVar2 + 0x5e0))(0x8c36);
    (**(code **)(lVar2 + 0xdc8))(0x3f000000);
    err = (**(code **)(lVar2 + 0x800))();
    glu::checkError(err,"enable sample shading",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x449);
    local_190.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &local_190.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Enabled GL_SAMPLE_SHADING, value = 0.5");
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  return;
}

Assistant:

void SampleMaskBaseCase::preDraw (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_runMode == RUN_PER_TWO_SAMPLES)
	{
		gl.enable(GL_SAMPLE_SHADING);
		gl.minSampleShading(0.5f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable sample shading");

		m_testCtx.getLog() << tcu::TestLog::Message << "Enabled GL_SAMPLE_SHADING, value = 0.5" << tcu::TestLog::EndMessage;
	}
}